

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QStyleSheetBorderData>::reset
          (QSharedDataPointer<QStyleSheetBorderData> *this,QStyleSheetBorderData *ptr)

{
  QStyleSheetBorderData *pQVar1;
  long lVar2;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != ptr) {
    if (ptr != (QStyleSheetBorderData *)0x0) {
      LOCK();
      (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
      .super___atomic_base<int>._M_i =
           (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar1 = (this->d).ptr;
    }
    (this->d).ptr = ptr;
    if (pQVar1 != (QStyleSheetBorderData *)0x0) {
      LOCK();
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i == 0) {
        QSharedDataPointer<QStyleSheetBorderImageData>::~QSharedDataPointer(&pQVar1->bi);
        lVar2 = 0x30;
        do {
          QBrush::~QBrush((QBrush *)((long)pQVar1->borders + lVar2 + -4));
          lVar2 = lVar2 + -8;
        } while (lVar2 != 0x10);
        operator_delete(pQVar1,0x70);
        return;
      }
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }